

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score.cc
# Opt level: O2

void __thiscall
xLearn::FMScore::calc_grad_ftrl(FMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  float *pfVar1;
  float *pfVar2;
  real_t *prVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  undefined8 uVar7;
  float fVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  pointer pNVar11;
  pointer pNVar12;
  ulong uVar13;
  int iVar14;
  real_t *prVar15;
  index_t d_1;
  ulong uVar16;
  int iVar17;
  long lVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  real_t rVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_ZMM6 [64];
  allocator_type local_119;
  undefined1 local_118 [16];
  SparseRow *local_108;
  Model *local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  real_t *local_d8;
  int local_cc;
  undefined1 local_c8 [16];
  pointer local_b8;
  pointer local_b0;
  real_t *local_a8;
  real_t *local_a0;
  real_t *local_98;
  value_type local_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  vector<float,_std::allocator<float>_> sv;
  
  auVar32._4_60_ = in_register_00001244;
  auVar32._0_4_ = norm;
  local_108 = row;
  local_100 = model;
  if (norm < 0.0) {
    local_f8._0_4_ = sqrtf(norm);
  }
  else {
    auVar27 = vsqrtss_avx(auVar32._0_16_,auVar32._0_16_);
    local_f8._0_4_ = auVar27._0_4_;
  }
  prVar15 = local_100->param_w_;
  uVar5 = local_100->num_feat_;
  for (pNVar11 = (local_108->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                 _M_impl.super__Vector_impl_data._M_start; auVar27 = in_ZMM6._0_16_,
      pNVar11 !=
      (local_108->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
      super__Vector_impl_data._M_finish; pNVar11 = pNVar11 + 1) {
    uVar6 = pNVar11->feat_id;
    if (uVar6 < uVar5) {
      uVar9 = uVar6 * 3;
      uVar16 = (ulong)uVar6 * 3 + 1 & 0xffffffff;
      fVar21 = prVar15[uVar16];
      auVar25 = vfmadd231ss_fma(ZEXT416((uint)(pg * pNVar11->feat_val * (float)local_f8._0_4_)),
                                ZEXT416((uint)(this->super_Score).lambda_2_),
                                ZEXT416((uint)prVar15[uVar9]));
      auVar27 = vfmadd213ss_fma(auVar25,auVar25,ZEXT416((uint)fVar21));
      local_118._0_4_ = auVar25._0_4_;
      fVar20 = auVar27._0_4_;
      prVar15[uVar16] = fVar20;
      if (fVar20 < 0.0) {
        local_e8._0_4_ = fVar21;
        fVar20 = sqrtf(fVar20);
        fVar21 = (float)local_e8._0_4_;
      }
      else {
        auVar27 = vsqrtss_avx(auVar27,auVar27);
        fVar20 = auVar27._0_4_;
      }
      if (fVar21 < 0.0) {
        local_e8._0_4_ = fVar20;
        fVar21 = sqrtf(fVar21);
        fVar20 = (float)local_e8._0_4_;
      }
      else {
        auVar27 = vsqrtss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
        fVar21 = auVar27._0_4_;
      }
      auVar23._0_4_ = (fVar20 - fVar21) / (this->super_Score).alpha_;
      auVar23._4_12_ = SUB6012((undefined1  [60])0x0,0);
      uVar13 = (ulong)uVar6 * 3 + 2 & 0xffffffff;
      auVar27 = vfnmadd231ss_fma(ZEXT416((uint)local_118._0_4_),auVar23,
                                 ZEXT416((uint)prVar15[uVar9]));
      fVar20 = auVar27._0_4_ + prVar15[uVar13];
      auVar24 = ZEXT816(0);
      uVar7 = vcmpss_avx512f(auVar24,ZEXT416((uint)fVar20),1);
      bVar19 = (bool)((byte)uVar7 & 1);
      prVar15[uVar13] = fVar20;
      fVar21 = (this->super_Score).lambda_1_;
      fVar8 = (float)((uint)bVar19 * 0x3f800000 + (uint)!bVar19 * -0x40800000);
      if (fVar21 < fVar20 * fVar8) {
        fVar22 = prVar15[uVar16];
        rVar28 = (this->super_Score).beta_;
        if (fVar22 < 0.0) {
          local_118._0_4_ = fVar20;
          local_e8._0_4_ = fVar21;
          local_c8 = ZEXT416((uint)fVar8);
          local_d8 = (real_t *)CONCAT44(local_d8._4_4_,rVar28);
          fVar22 = sqrtf(fVar22);
          rVar28 = local_d8._0_4_;
          fVar21 = (float)local_e8._0_4_;
          auVar27 = local_c8;
          fVar20 = (float)local_118._0_4_;
        }
        else {
          auVar27 = vsqrtss_avx(ZEXT416((uint)fVar22),ZEXT416((uint)fVar22));
          fVar22 = auVar27._0_4_;
          auVar27 = ZEXT416((uint)fVar8);
        }
        auVar27 = vfmsub213ss_fma(ZEXT416((uint)fVar21),auVar27,ZEXT416((uint)fVar20));
        auVar24._0_4_ =
             auVar27._0_4_ /
             ((rVar28 + fVar22) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
        auVar24._4_12_ = auVar27._4_12_;
      }
      prVar15[uVar9] = auVar24._0_4_;
    }
  }
  prVar15 = local_100->param_b_;
  fVar21 = prVar15[1];
  auVar25 = vfmadd213ss_fma(ZEXT416((uint)pg),ZEXT416((uint)pg),ZEXT416((uint)fVar21));
  fVar20 = auVar25._0_4_;
  prVar15[1] = fVar20;
  if (fVar20 < 0.0) {
    local_118._0_4_ = fVar21;
    fVar20 = sqrtf(fVar20);
    fVar21 = (float)local_118._0_4_;
  }
  else {
    auVar25 = vsqrtss_avx(auVar25,auVar25);
    fVar20 = auVar25._0_4_;
  }
  if (fVar21 < 0.0) {
    local_118._0_4_ = fVar20;
    fVar21 = sqrtf(fVar21);
    fVar20 = (float)local_118._0_4_;
  }
  else {
    auVar25 = vsqrtss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
    fVar21 = auVar25._0_4_;
  }
  auVar25._0_4_ = (fVar20 - fVar21) / (this->super_Score).alpha_;
  auVar25._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar25 = vfnmadd132ss_fma(auVar25,ZEXT416((uint)pg),ZEXT416((uint)*prVar15));
  auVar29._0_12_ = ZEXT812(0);
  auVar29._12_4_ = 0;
  fVar20 = auVar25._0_4_ + prVar15[2];
  uVar7 = vcmpss_avx512f(auVar29,ZEXT416((uint)fVar20),1);
  bVar19 = (bool)((byte)uVar7 & 1);
  prVar15[2] = fVar20;
  fVar21 = (this->super_Score).lambda_1_;
  fVar8 = (float)((uint)bVar19 * 0x3f800000 + (uint)!bVar19 * -0x40800000);
  if (fVar21 < fVar20 * fVar8) {
    auVar25 = vfmsub213ss_fma(ZEXT416((uint)fVar21),ZEXT416((uint)fVar8),ZEXT416((uint)fVar20));
    fVar21 = prVar15[1];
    fVar20 = (this->super_Score).beta_;
    if (fVar21 < 0.0) {
      local_118._0_4_ = auVar25._0_4_;
      local_f8._0_4_ = fVar20;
      fVar21 = sqrtf(fVar21);
      auVar25 = ZEXT416((uint)local_118._0_4_);
    }
    else {
      auVar29 = vsqrtss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
      fVar21 = auVar29._0_4_;
      local_f8._0_4_ = fVar20;
    }
    auVar29._0_4_ =
         auVar25._0_4_ /
         (((float)local_f8._0_4_ + fVar21) / (this->super_Score).alpha_ +
         (this->super_Score).lambda_2_);
    auVar29._4_12_ = auVar25._4_12_;
  }
  *prVar15 = auVar29._0_4_;
  auVar25 = vcvtusi2ss_avx512f(auVar27,local_100->num_K_);
  local_118._0_4_ = (this->super_Score).alpha_;
  local_118._4_4_ = (this->super_Score).beta_;
  local_118._8_4_ = (this->super_Score).lambda_1_;
  local_118._12_4_ = (this->super_Score).lambda_2_;
  auVar25 = ZEXT416((uint)(auVar25._0_4_ * 0.25));
  auVar25 = vroundss_avx(auVar25,auVar25,10);
  iVar17 = vcvttss2usi_avx512f(auVar25);
  uVar16 = (ulong)(uint)(iVar17 * 4);
  auVar25 = vcvtusi2ss_avx512f(auVar27,iVar17 * 4);
  auVar27 = vcvtusi2ss_avx512f(auVar27,local_100->aux_size_);
  local_f8 = *(undefined1 (*) [16])&(this->super_Score).lambda_2_;
  local_8c = 0.0;
  iVar14 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar27._0_4_ * auVar25._0_4_)));
  std::vector<float,_std::allocator<float>_>::vector(&sv,uVar16,&local_8c,&local_119);
  for (pNVar11 = (local_108->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      pNVar11 !=
      (local_108->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
      super__Vector_impl_data._M_finish; pNVar11 = pNVar11 + 1) {
    uVar6 = pNVar11->feat_id;
    if (uVar6 < uVar5) {
      fVar21 = norm * pNVar11->feat_val;
      prVar15 = local_100->param_v_;
      for (uVar13 = 0; uVar13 < uVar16; uVar13 = uVar13 + 4) {
        pfVar1 = prVar15 + uVar6 * iVar14 + uVar13;
        pfVar2 = sv.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar13;
        auVar30._0_4_ = fVar21 * *pfVar1 + *pfVar2;
        auVar30._4_4_ = fVar21 * pfVar1[1] + pfVar2[1];
        auVar30._8_4_ = fVar21 * pfVar1[2] + pfVar2[2];
        auVar30._12_4_ = fVar21 * pfVar1[3] + pfVar2[3];
        *(undefined1 (*) [16])
         (sv.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start + uVar13) = auVar30;
      }
    }
  }
  local_b0 = sv.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start;
  pNVar12 = (local_108->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_78 = local_118._0_4_;
  uStack_74 = local_118._0_4_;
  uStack_70 = local_118._0_4_;
  uStack_6c = local_118._0_4_;
  local_88 = (float)local_f8._0_4_;
  fStack_84 = (float)local_f8._0_4_;
  fStack_80 = (float)local_f8._0_4_;
  fStack_7c = (float)local_f8._0_4_;
  local_cc = iVar14;
  for (; pNVar12 != pNVar11; pNVar12 = pNVar12 + 1) {
    if (pNVar12->feat_id < uVar5) {
      local_68 = norm * pNVar12->feat_val;
      prVar15 = local_100->param_v_ + pNVar12->feat_id * iVar14;
      local_58._4_4_ = local_68;
      local_58._0_4_ = local_68;
      fStack_50 = local_68;
      fStack_4c = local_68;
      local_68 = local_68 * pg;
      local_a0 = prVar15 + uVar16;
      local_a8 = prVar15 + (uint)(iVar17 << 3);
      local_b8 = pNVar12;
      local_98 = prVar15;
      fStack_64 = local_68;
      fStack_60 = local_68;
      fStack_5c = local_68;
      for (uVar13 = 0; uVar13 < uVar16; uVar13 = uVar13 + 4) {
        pfVar1 = local_98 + uVar13;
        fVar21 = *pfVar1;
        fVar20 = pfVar1[1];
        fVar8 = pfVar1[2];
        fVar22 = pfVar1[3];
        auVar34._0_4_ = fVar21 * (float)local_58._0_4_;
        auVar34._4_4_ = fVar20 * (float)local_58._4_4_;
        auVar34._8_4_ = fVar8 * fStack_50;
        auVar34._12_4_ = fVar22 * fStack_4c;
        auVar27 = *(undefined1 (*) [16])(local_a0 + uVar13);
        auVar25 = vsubps_avx(*(undefined1 (*) [16])
                              (sv.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start + uVar13),auVar34);
        auVar26._0_4_ = fVar21 * local_88 + auVar25._0_4_ * local_68;
        auVar26._4_4_ = fVar20 * fStack_84 + auVar25._4_4_ * fStack_64;
        auVar26._8_4_ = fVar8 * fStack_80 + auVar25._8_4_ * fStack_60;
        auVar26._12_4_ = fVar22 * fStack_7c + auVar25._12_4_ * fStack_5c;
        auVar33._0_4_ = auVar27._0_4_ + auVar26._0_4_ * auVar26._0_4_;
        auVar33._4_4_ = auVar27._4_4_ + auVar26._4_4_ * auVar26._4_4_;
        auVar33._8_4_ = auVar27._8_4_ + auVar26._8_4_ * auVar26._8_4_;
        auVar33._12_4_ = auVar27._12_4_ + auVar26._12_4_ * auVar26._12_4_;
        auVar27 = vsqrtps_avx(auVar27);
        auVar25 = vsqrtps_avx(auVar33);
        auVar27 = vsubps_avx(auVar25,auVar27);
        auVar10._4_4_ = uStack_74;
        auVar10._0_4_ = local_78;
        auVar10._8_4_ = uStack_70;
        auVar10._12_4_ = uStack_6c;
        auVar27 = vdivps_avx(auVar27,auVar10);
        auVar31._0_4_ = fVar21 * auVar27._0_4_;
        auVar31._4_4_ = fVar20 * auVar27._4_4_;
        auVar31._8_4_ = fVar8 * auVar27._8_4_;
        auVar31._12_4_ = fVar22 * auVar27._12_4_;
        auVar27 = vsubps_avx(auVar26,auVar31);
        pfVar1 = local_a8 + uVar13;
        fVar21 = pfVar1[1];
        fVar20 = pfVar1[2];
        fVar8 = pfVar1[3];
        prVar3 = local_a8 + uVar13;
        *prVar3 = auVar27._0_4_ + *pfVar1;
        prVar3[1] = auVar27._4_4_ + fVar21;
        prVar3[2] = auVar27._8_4_ + fVar20;
        prVar3[3] = auVar27._12_4_ + fVar8;
        *(undefined1 (*) [16])(local_a0 + uVar13) = auVar33;
        lVar18 = 4;
        local_d8 = prVar15;
        while (bVar19 = lVar18 != 0, lVar18 = lVar18 + -1, bVar19) {
          fVar21 = prVar15[(uint)(iVar17 << 3)];
          auVar27 = ZEXT816(0) << 0x40;
          fVar20 = (this->super_Score).lambda_1_;
          uVar7 = vcmpss_avx512f(auVar27,ZEXT416((uint)fVar21),1);
          bVar19 = (bool)((byte)uVar7 & 1);
          fVar8 = (float)((uint)bVar19 * 0x3f800000 + (uint)!bVar19 * -0x40800000);
          if (fVar20 < fVar21 * fVar8) {
            fVar22 = prVar15[uVar16];
            fVar4 = (this->super_Score).beta_;
            if (fVar22 < 0.0) {
              local_118._0_4_ = fVar21;
              local_f8._0_4_ = fVar20;
              local_e8 = ZEXT416((uint)fVar8);
              local_c8._0_4_ = fVar4;
              fVar22 = sqrtf(fVar22);
              fVar4 = (float)local_c8._0_4_;
              fVar20 = (float)local_f8._0_4_;
              fVar21 = (float)local_118._0_4_;
              auVar27 = local_e8;
            }
            else {
              auVar27 = vsqrtss_avx(ZEXT416((uint)fVar22),ZEXT416((uint)fVar22));
              fVar22 = auVar27._0_4_;
              auVar27 = ZEXT416((uint)fVar8);
            }
            auVar25 = vfmsub213ss_fma(ZEXT416((uint)fVar20),auVar27,ZEXT416((uint)fVar21));
            auVar27._0_4_ =
                 auVar25._0_4_ /
                 ((fVar4 + fVar22) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
            auVar27._4_12_ = auVar25._4_12_;
          }
          *prVar15 = auVar27._0_4_;
          prVar15 = prVar15 + 1;
        }
        prVar15 = local_d8 + 4;
        sv.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = local_b0;
      }
      pNVar11 = (local_108->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl
                .super__Vector_impl_data._M_finish;
      pNVar12 = local_b8;
      iVar14 = local_cc;
    }
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&sv.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void FMScore::calc_grad_ftrl(const SparseRow* row,
                             Model& model,
                             real_t pg,
                             real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id*3];
    real_t &wlg = w[feat_id*3+1];
    real_t &wlz = w[feat_id*3+2];
    real_t g = lambda_2_*wl+pg*iter->feat_val*sqrt_norm; 
    real_t old_wlg = wlg;
    wlg += g*g;
    real_t sigma = (sqrt(wlg)-sqrt(old_wlg)) / alpha_;
    wlz += (g-sigma*wl);
    int sign = wlz > 0 ? 1:-1;
    if (sign*wlz <= lambda_1_) {
      wl = 0;
    } else {
      wl = (sign*lambda_1_-wlz) / 
           ((beta_ + sqrt(wlg)) / 
            alpha_ + lambda_2_);
    }
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t &wbz = w[2];
  real_t g = pg;
  real_t old_wbg = wbg;
  wbg += g*g;
  real_t sigma = (sqrt(wbg)-sqrt(old_wbg)) / alpha_;
  wbz += (g-sigma*wb);
  int sign = wbz > 0 ? 1:-1;
  if (sign*wbz <= lambda_1_) {
    wb = 0;
  } else {
    wb = (sign*lambda_1_-wbz) / 
         ((beta_ + sqrt(wbg)) / 
          alpha_ + lambda_2_);
  }  
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t aligned_k = model.get_aligned_k();
  index_t align0 = model.get_aligned_k() * 
                   model.GetAuxiliarySize();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMalpha = _mm_set1_ps(alpha_);
  __m128 XMML2 = _mm_set1_ps(lambda_2_);
  std::vector<real_t> sv(aligned_k, 0);
  real_t* s = sv.data();
 for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 const XMMw = _mm_load_ps(w+d);
      XMMs = _mm_add_ps(XMMs, _mm_mul_ps(XMMw, XMMv));
      _mm_store_ps(s+d, XMMs);
    }
  }
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w_base = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    __m128 XMMpgv = _mm_mul_ps(XMMpg, XMMv);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      real_t* w = w_base + d;
      real_t* wg = w_base + aligned_k + d;
      real_t* z = w_base + aligned_k*2 + d;
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 XMMw = _mm_load_ps(w);
      __m128 XMMwg = _mm_load_ps(wg);
      __m128 XMMz = _mm_load_ps(z);
      __m128 XMMg = _mm_add_ps(
                    _mm_mul_ps(XMML2, XMMw),
                    _mm_mul_ps(XMMpgv,
                    _mm_sub_ps(XMMs,
                      _mm_mul_ps(XMMw, XMMv))));
      __m128 XMMsigma = _mm_div_ps(
                        _mm_sub_ps(
                        _mm_sqrt_ps(
                        _mm_add_ps(XMMwg,
                        _mm_mul_ps(XMMg, XMMg))),
                        _mm_sqrt_ps(XMMwg)), XMMalpha);
      XMMz = _mm_add_ps(XMMz,
             _mm_sub_ps(XMMg,
             _mm_mul_ps(XMMsigma, XMMw)));
      _mm_store_ps(z, XMMz);
      XMMwg = _mm_add_ps(XMMwg,
              _mm_mul_ps(XMMg, XMMg));
      _mm_store_ps(wg, XMMwg);
      // Update w. SSE mat not faster.
      for (size_t i = 0; i < kAlign; ++i) {
        real_t z_value = *(z+i);
        int sign = z_value > 0 ? 1:-1;
        if (sign * z_value <= lambda_1_) {
          *(w+i) = 0;
        } else {
          *(w+i) = (sign*lambda_1_-z_value) / 
              ((beta_ + sqrt(*(wg+i))) / alpha_ + lambda_2_);
        }
      }
    }
  }
}